

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::DitheringCase::drawAndCheckGradient
          (DitheringCase *this,bool isVerticallyIncreasing,Vec4 *highColor)

{
  ostringstream *poVar1;
  RGBA c;
  RenderContext *context;
  byte bVar2;
  int iVar3;
  bool bVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  GLenum GVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Vec4 *pVVar10;
  Surface *pSVar11;
  long lVar12;
  void *__buf;
  void *__buf_00;
  RGBA c_00;
  undefined7 in_register_00000031;
  char *pcVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  char cVar18;
  float s;
  allocator<char> local_311;
  undefined4 local_310;
  allocator<char> local_309;
  TestLog *local_308;
  DitheringCase *local_300;
  Surface renderedImg;
  Surface errorMask;
  string local_2b8;
  Vec4 inputClr;
  Vec4 local_278;
  MessageBuilder local_260;
  Random rnd;
  Quad quad;
  
  local_308 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  dVar5 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar5);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = *(int *)CONCAT44(extraout_var,iVar6);
  if (0xff < iVar6) {
    iVar6 = 0x100;
  }
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = *(int *)(CONCAT44(extraout_var_00,iVar7) + 4);
  iVar16 = 0x100;
  if (iVar7 < 0x100) {
    iVar16 = iVar7;
  }
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = de::Random::getInt((Random *)&rnd.m_rnd,0,*(int *)CONCAT44(extraout_var_01,iVar7) - iVar6)
  ;
  local_300 = this;
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar8 = de::Random::getInt((Random *)&rnd.m_rnd,0,
                             *(int *)(CONCAT44(extraout_var_02,iVar8) + 4) - iVar16);
  local_278.m_data[0] = 0.0;
  local_278.m_data[1] = 0.0;
  local_278.m_data[2] = 0.0;
  local_278.m_data[3] = 0.0;
  deqp::gls::FragmentOpUtil::Quad::Quad(&quad);
  tcu::Surface::Surface(&renderedImg,iVar6,iVar16);
  glwViewport(iVar7,iVar8,iVar6,iVar16);
  GVar9 = glwGetError();
  glu::checkError(GVar9,"glViewport(viewportX, viewportY, viewportWid, viewportHei)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,0xfe);
  poVar1 = &local_260.m_str;
  local_260.m_log = local_308;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Dithering is ");
  pcVar13 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if (local_300->m_ditheringEnabled != false) {
    pcVar13 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::operator<<((ostream *)poVar1,pcVar13 + 0x27);
  tcu::MessageBuilder::operator<<(&local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (local_300->m_ditheringEnabled == true) {
    glwEnable(0xbd0);
    dVar5 = glwGetError();
    iVar17 = 0x103;
    pcVar13 = "glEnable(GL_DITHER)";
  }
  else {
    glwDisable(0xbd0);
    dVar5 = glwGetError();
    iVar17 = 0x105;
    pcVar13 = "glDisable(GL_DITHER)";
  }
  glu::checkError(dVar5,pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,iVar17);
  poVar1 = &local_260.m_str;
  local_260.m_log = local_308;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Drawing a ");
  pcVar13 = "horizontally";
  if (isVerticallyIncreasing) {
    pcVar13 = "vertically";
  }
  std::operator<<((ostream *)poVar1,pcVar13);
  std::operator<<((ostream *)poVar1," increasing gradient");
  tcu::MessageBuilder::operator<<(&local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  quad.color[0].m_data[0] = local_278.m_data[0];
  quad.color[0].m_data[1] = local_278.m_data[1];
  quad.color[0].m_data[2] = local_278.m_data[2];
  quad.color[0].m_data[3] = local_278.m_data[3];
  pVVar10 = &local_278;
  if (isVerticallyIncreasing) {
    pVVar10 = highColor;
  }
  quad.color[1].m_data._0_8_ = *(undefined8 *)pVVar10->m_data;
  quad.color[1].m_data._8_8_ = *(undefined8 *)(pVVar10->m_data + 2);
  pVVar10 = &local_278;
  if (!isVerticallyIncreasing) {
    pVVar10 = highColor;
  }
  quad.color[2].m_data._0_8_ = *(undefined8 *)pVVar10->m_data;
  quad.color[2].m_data._8_8_ = *(undefined8 *)(pVVar10->m_data + 2);
  quad.color[3].m_data._0_8_ = *(undefined8 *)highColor->m_data;
  quad.color[3].m_data._8_8_ = *(undefined8 *)(highColor->m_data + 2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(local_300->m_renderer,&quad);
  context = local_300->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_260,&renderedImg);
  glu::readPixels(context,iVar7,iVar8,(PixelBufferAccess *)&local_260);
  GVar9 = glwGetError();
  glu::checkError(GVar9,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,0x111);
  pcVar13 = "HorGradient";
  if (isVerticallyIncreasing) {
    pcVar13 = "VerGradient";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputClr,pcVar13,(allocator<char> *)&errorMask);
  pcVar13 = "Horizontal gradient";
  if (isVerticallyIncreasing) {
    pcVar13 = "Vertical gradient";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,pcVar13,&local_311);
  pSVar11 = &renderedImg;
  tcu::LogImage::LogImage
            ((LogImage *)&local_260,(string *)&inputClr,&local_2b8,pSVar11,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&local_260,(int)local_308,__buf,(size_t)pSVar11);
  local_310 = (undefined4)CONCAT71(in_register_00000031,isVerticallyIncreasing);
  tcu::LogImage::~LogImage((LogImage *)&local_260);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&inputClr);
  tcu::Surface::Surface(&errorMask,iVar6,iVar16);
  bVar14 = true;
  for (iVar6 = 0; iVar6 < renderedImg.m_height; iVar6 = iVar6 + 1) {
    for (iVar7 = 0; iVar7 < renderedImg.m_width; iVar7 = iVar7 + 1) {
      iVar16 = iVar7;
      if ((char)local_310 != '\0') {
        iVar16 = iVar6;
      }
      iVar8 = renderedImg.m_width;
      if ((char)local_310 != '\0') {
        iVar8 = renderedImg.m_height;
      }
      s = ((float)iVar16 + 0.5) / (float)iVar8;
      tcu::operator*((tcu *)&local_260,1.0 - s,&local_278);
      tcu::operator*((tcu *)&local_2b8,s,highColor);
      tcu::operator+((tcu *)&inputClr,(Vector<float,_4> *)&local_260,(Vector<float,_4> *)&local_2b8)
      ;
      local_260.m_log =
           (TestLog *)
           CONCAT44(local_260.m_log._4_4_,
                    *(undefined4 *)
                     ((long)renderedImg.m_pixels.m_ptr +
                     (long)(renderedImg.m_width * iVar6 + iVar7) * 4));
      bVar4 = checkColor(local_300,&inputClr,(RGBA *)&local_260,bVar14);
      lVar12 = (long)(errorMask.m_width * iVar6 + iVar7);
      if (bVar4) {
        *(undefined4 *)((long)errorMask.m_pixels.m_ptr + lVar12 * 4) = 0xff00ff00;
      }
      else {
        *(undefined4 *)((long)errorMask.m_pixels.m_ptr + lVar12 * 4) = 0xff0000ff;
        if (bVar14) {
          local_260.m_log = local_308;
          poVar1 = &local_260.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          std::operator<<((ostream *)poVar1,"First failure at pixel (");
          std::ostream::operator<<(poVar1,iVar7);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,iVar6);
          std::operator<<((ostream *)poVar1,") (not printing further errors)");
          tcu::MessageBuilder::operator<<(&local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
          bVar14 = false;
        }
      }
    }
  }
  if (bVar14 == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inputClr,"ColorChoiceErrorMask",&local_311);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"Error mask for color choices",&local_309);
    pSVar11 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&local_260,(string *)&inputClr,&local_2b8,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&local_260,(int)local_308,__buf_00,(size_t)pSVar11);
    tcu::LogImage::~LogImage((LogImage *)&local_260);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&inputClr);
    tcu::Surface::~Surface(&errorMask);
LAB_006217a0:
    bVar14 = false;
  }
  else {
    tcu::Surface::~Surface(&errorMask);
    bVar14 = true;
    if (local_300->m_ditheringEnabled == false) {
      iVar6 = renderedImg.m_height;
      iVar7 = renderedImg.m_width;
      if ((char)local_310 != '\0') {
        iVar6 = renderedImg.m_width;
        iVar7 = renderedImg.m_height;
      }
      bVar2 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      iVar16 = 0;
      if (0 < iVar7) {
        iVar16 = iVar7;
      }
      for (iVar8 = 0; iVar8 != iVar16; iVar8 = iVar8 + 1) {
        c_00.m_value = 0;
        for (iVar17 = 0; iVar6 != iVar17; iVar17 = iVar17 + 1) {
          iVar15 = iVar17;
          iVar3 = iVar8;
          if ((char)local_310 != '\0') {
            iVar15 = iVar8;
            iVar3 = iVar17;
          }
          c.m_value = *(deUint32 *)
                       ((long)renderedImg.m_pixels.m_ptr +
                       (long)(renderedImg.m_width * iVar15 + iVar3) * 4);
          bVar14 = c.m_value != c_00.m_value && iVar17 != 0;
          if ((bool)(bVar14 & bVar2)) {
            local_260.m_log = local_308;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_260.m_str);
            std::operator<<((ostream *)&local_260.m_str,"Failure: colors should be constant per ");
            pcVar13 = "column";
            if ((char)local_310 != '\0') {
              pcVar13 = "row";
            }
            std::operator<<((ostream *)&local_260.m_str,pcVar13);
            std::operator<<((ostream *)&local_260.m_str,
                            " (since dithering is disabled), but the color at position (");
            std::ostream::operator<<(&local_260.m_str,iVar3);
            std::operator<<((ostream *)&local_260.m_str,", ");
            std::ostream::operator<<(&local_260.m_str,iVar15);
            std::operator<<((ostream *)&local_260.m_str,") is ");
            tcu::operator<<((ostream *)&local_260.m_str,c);
            std::operator<<((ostream *)&local_260.m_str," and does not equal the color at (");
            cVar18 = (char)local_310;
            iVar6 = iVar8;
            if (cVar18 != '\0') {
              iVar6 = iVar17 + -1;
            }
            poVar1 = &local_260.m_str;
            std::ostream::operator<<(poVar1,iVar6);
            std::operator<<((ostream *)poVar1,", ");
            iVar6 = iVar17 + -1;
            if (cVar18 != '\0') {
              iVar6 = iVar8;
            }
            std::ostream::operator<<(poVar1,iVar6);
            std::operator<<((ostream *)poVar1,"), which is ");
            tcu::operator<<((ostream *)poVar1,c_00);
            tcu::MessageBuilder::operator<<(&local_260,(EndMessageToken *)&tcu::TestLog::EndMessage)
            ;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
            goto LAB_006217a0;
          }
          bVar2 = bVar2 | bVar14;
          c_00.m_value = c.m_value;
        }
      }
      bVar14 = iVar7 <= iVar8;
    }
  }
  tcu::Surface::~Surface(&renderedImg);
  return bVar14;
}

Assistant:

bool DitheringCase::drawAndCheckGradient (const bool isVerticallyIncreasing, const Vec4& highColor) const
{
	TestLog&					log					= m_testCtx.getLog();
	Random						rnd					(deStringHash(getName()));
	const int					maxViewportWid		= 256;
	const int					maxViewportHei		= 256;
	const int					viewportWid			= de::min(m_renderCtx.getRenderTarget().getWidth(), maxViewportWid);
	const int					viewportHei			= de::min(m_renderCtx.getRenderTarget().getHeight(), maxViewportHei);
	const int					viewportX			= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth() - viewportWid);
	const int					viewportY			= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight() - viewportHei);
	const Vec4					quadClr0			(0.0f, 0.0f, 0.0f, 0.0f);
	const Vec4&					quadClr1			= highColor;
	Quad						quad;
	Surface						renderedImg			(viewportWid, viewportHei);

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportWid, viewportHei));

	log << TestLog::Message << "Dithering is " << (m_ditheringEnabled ? "enabled" : "disabled") << TestLog::EndMessage;

	if (m_ditheringEnabled)
		GLU_CHECK_CALL(glEnable(GL_DITHER));
	else
		GLU_CHECK_CALL(glDisable(GL_DITHER));

	log << TestLog::Message << "Drawing a " << (isVerticallyIncreasing ? "vertically" : "horizontally") << " increasing gradient" << TestLog::EndMessage;

	quad.color[0] = quadClr0;
	quad.color[1] = isVerticallyIncreasing ? quadClr1 : quadClr0;
	quad.color[2] = isVerticallyIncreasing ? quadClr0 : quadClr1;
	quad.color[3] = quadClr1;

	m_renderer->render(quad);

	glu::readPixels(m_renderCtx, viewportX, viewportY, renderedImg.getAccess());
	GLU_CHECK_MSG("glReadPixels()");

	log << TestLog::Image(isVerticallyIncreasing ? "VerGradient"		: "HorGradient",
						  isVerticallyIncreasing ? "Vertical gradient"	: "Horizontal gradient",
						  renderedImg);

	// Validate, at each pixel, that each color channel is one of its two allowed values.

	{
		Surface		errorMask		(viewportWid, viewportHei);
		bool		colorChoicesOk	= true;

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				const float		inputF		= ((float)(isVerticallyIncreasing ? y : x) + 0.5f) / (float)(isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth());
				const Vec4		inputClr	= (1.0f-inputF)*quadClr0 + inputF*quadClr1;

				if (!checkColor(inputClr, renderedImg.getPixel(x, y), colorChoicesOk))
				{
					errorMask.setPixel(x, y, tcu::RGBA::red());

					if (colorChoicesOk)
					{
						log << TestLog::Message << "First failure at pixel (" << x << ", " << y << ") (not printing further errors)" << TestLog::EndMessage;
						colorChoicesOk = false;
					}
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA::green());
			}
		}

		if (!colorChoicesOk)
		{
			log << TestLog::Image("ColorChoiceErrorMask", "Error mask for color choices", errorMask);
			return false;
		}
	}

	// When dithering is disabled, the color selection must be coordinate-independent - i.e. the colors must be constant in the gradient's constant direction.

	if (!m_ditheringEnabled)
	{
		const int	increasingDirectionSize	= isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth();
		const int	constantDirectionSize	= isVerticallyIncreasing ? renderedImg.getWidth() : renderedImg.getHeight();
		bool		colorHasChanged			= false;

		for (int incrPos = 0; incrPos < increasingDirectionSize; incrPos++)
		{
			tcu::RGBA prevConstantDirectionPix;
			for (int constPos = 0; constPos < constantDirectionSize; constPos++)
			{
				const int			x		= isVerticallyIncreasing ? constPos : incrPos;
				const int			y		= isVerticallyIncreasing ? incrPos : constPos;
				const tcu::RGBA		clr		= renderedImg.getPixel(x, y);

				if (constPos > 0 && clr != prevConstantDirectionPix)
				{
					if (colorHasChanged)
					{
						log << TestLog::Message
							<< "Failure: colors should be constant per " << (isVerticallyIncreasing ? "row" : "column")
							<< " (since dithering is disabled), but the color at position (" << x << ", " << y << ") is " << clr
							<< " and does not equal the color at (" << (isVerticallyIncreasing ? x-1 : x) << ", " << (isVerticallyIncreasing ? y : y-1) << "), which is " << prevConstantDirectionPix
							<< TestLog::EndMessage;

						return false;
					}
					else
						colorHasChanged = true;
				}

				prevConstantDirectionPix = clr;
			}
		}
	}

	return true;
}